

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_asm.c
# Opt level: O0

void emit_asm_label(BuildCtx *ctx,char *name,int size,int isfunc)

{
  int iVar1;
  int in_ECX;
  undefined8 in_RSI;
  long in_RDI;
  char *pcVar2;
  
  iVar1 = *(int *)(in_RDI + 8);
  if (iVar1 == 0) {
    pcVar2 = "object";
    if (in_ECX != 0) {
      pcVar2 = "function";
    }
    fprintf(*(FILE **)(in_RDI + 0x10),
            "\n\t.globl %s\n\t.hidden %s\n\t.type %s, @%s\n\t.size %s, %d\n%s:\n",in_RSI,in_RSI,
            in_RSI,pcVar2);
  }
  else if (iVar1 == 1) {
    fprintf(*(FILE **)(in_RDI + 0x10),"\n\t.globl %s\n",in_RSI);
    if (in_ECX != 0) {
      fprintf(*(FILE **)(in_RDI + 0x10),"\t.def %s; .scl 3; .type 32; .endef\n",in_RSI);
    }
    fprintf(*(FILE **)(in_RDI + 0x10),"%s:\n",in_RSI);
  }
  else if (iVar1 == 2) {
    fprintf(*(FILE **)(in_RDI + 0x10),"\n\t.private_extern %s\n\t.no_dead_strip %s\n%s:\n",in_RSI,
            in_RSI,in_RSI);
  }
  return;
}

Assistant:

static void emit_asm_label(BuildCtx *ctx, const char *name, int size, int isfunc)
{
  switch (ctx->mode) {
  case BUILD_elfasm:
#if LJ_TARGET_PS3
    if (!strncmp(name, "lj_vm_", 6) &&
	strcmp(name, ctx->beginsym) &&
	!strstr(name, "hook")) {
      fprintf(ctx->fp,
	"\n\t.globl %s\n"
	"\t.section \".opd\",\"aw\"\n"
	"%s:\n"
	"\t.long .%s,.TOC.@tocbase32\n"
	"\t.size %s,8\n"
	"\t.previous\n"
	"\t.globl .%s\n"
	"\t.hidden .%s\n"
	"\t.type .%s, " ELFASM_PX "function\n"
	"\t.size .%s, %d\n"
	".%s:\n",
	name, name, name, name, name, name, name, name, size, name);
      break;
    }
#endif
    fprintf(ctx->fp,
      "\n\t.globl %s\n"
      "\t.hidden %s\n"
      "\t.type %s, " ELFASM_PX "%s\n"
      "\t.size %s, %d\n"
      "%s:\n",
      name, name, name, isfunc ? "function" : "object", name, size, name);
    break;
  case BUILD_coffasm:
    fprintf(ctx->fp, "\n\t.globl %s\n", name);
    if (isfunc)
      fprintf(ctx->fp, "\t.def %s; .scl 3; .type 32; .endef\n", name);
    fprintf(ctx->fp, "%s:\n", name);
    break;
  case BUILD_machasm:
    fprintf(ctx->fp,
      "\n\t.private_extern %s\n"
      "\t.no_dead_strip %s\n"
      "%s:\n", name, name, name);
    break;
  default:
    break;
  }
}